

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::leSI64x2(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *other_00;
  Type *__return_storage_ptr___00;
  bool bVar1;
  Literal *other_01;
  long lVar2;
  Literal *this_00;
  bool bVar3;
  undefined1 local_e0 [8];
  LaneArray<2> other_lanes;
  undefined1 local_98 [8];
  LaneArray<2> lanes;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  this_00 = (Literal *)local_98;
  local_38 = __return_storage_ptr__;
  getLanesI64x2((LaneArray<2> *)this_00,this);
  other_01 = (Literal *)local_e0;
  getLanesI64x2((LaneArray<2> *)other_01,other);
  __return_storage_ptr___00 = &other_lanes._M_elems[1].type;
  other_00 = &lanes._M_elems[1].type;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    leS((Literal *)__return_storage_ptr___00,this_00,other_01);
    local_50.i32 = 1;
    local_40 = 2;
    bVar1 = operator==((Literal *)__return_storage_ptr___00,(Literal *)&local_50.func);
    lanes._M_elems[1].type.id = -(ulong)bVar1;
    ~Literal(this_00);
    Literal(this_00,(Literal *)other_00);
    ~Literal((Literal *)other_00);
    ~Literal((Literal *)&local_50.func);
    ~Literal((Literal *)__return_storage_ptr___00);
    other_01 = (Literal *)&other_lanes._M_elems[0].type;
    this_00 = (Literal *)&lanes._M_elems[0].type;
    bVar1 = false;
  } while (bVar3);
  Literal(local_38,(LaneArray<2> *)local_98);
  lVar2 = 0x18;
  do {
    ~Literal((Literal *)(local_e0 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  lVar2 = 0x18;
  do {
    ~Literal((Literal *)(local_98 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return local_38;
}

Assistant:

Literal Literal::leSI64x2(const Literal& other) const {
  return compare<2, &Literal::getLanesI64x2, &Literal::leS, int64_t>(*this,
                                                                     other);
}